

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles2::Functional::DepthStencilCaseUtil::generateBaseClearAndDepthCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
               *clearCommands,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *renderCommands)

{
  float stencil_;
  int iVar1;
  int iVar2;
  int width_;
  int height_;
  NotSupportedError *this;
  Vector<bool,_4> local_200;
  undefined1 local_1fc [8];
  RenderCommand renderCmd;
  ClearCommand local_178;
  undefined1 local_150 [8];
  WindowRectangle cellL1Rect;
  int y;
  int x;
  int x1;
  int y1;
  int stencilValue;
  int x0;
  int y0;
  int ndx;
  float depthStep;
  int numValues;
  WindowRectangle local_108;
  ClearCommand local_f8;
  undefined1 local_cd;
  allocator<char> local_b9;
  string local_b8;
  float afStack_94 [2];
  float depthValues [3];
  int stencilValues [16];
  int cellL1Height;
  int cellL1Width;
  int cellL0Height;
  int cellL0Width;
  int numL1CellsY;
  int numL1CellsX;
  int numL0CellsY;
  int numL0CellsX;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
  *renderCommands_local;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
  *clearCommands_local;
  TestRenderTarget *target_local;
  
  iVar1 = target->width / 4;
  iVar2 = target->height / 4;
  width_ = iVar1 / 3;
  height_ = iVar2 / 1;
  if ((((0 < iVar1) && (0 < width_)) && (0 < iVar2)) && (0 < height_)) {
    rr::WindowRectangle::WindowRectangle(&local_108,0,0,target->width,target->height);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&depthStep,0.0,0.0,0.0,1.0);
    ClearCommand::ClearCommand(&local_f8,&local_108,0x4000,(Vec4 *)&depthStep,0);
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
    ::push_back(clearCommands,&local_f8);
    getStencilTestValues(target->stencilBits,0x10,(int *)(depthValues + 1));
    for (x0 = 0; x0 < 3; x0 = x0 + 1) {
      afStack_94[x0] = (float)x0 * 1.0 + -1.0;
    }
    for (stencilValue = 0; stencilValue < 4; stencilValue = stencilValue + 1) {
      for (y1 = 0; y1 < 4; y1 = y1 + 1) {
        stencil_ = depthValues[(long)(stencilValue * 4 + y1) + 1];
        for (x = 0; x < 1; x = x + 1) {
          for (y = 0; y < 3; y = y + 1) {
            cellL1Rect.height = y1 * iVar1 + y * width_;
            cellL1Rect.width = stencilValue * iVar2 + x * height_;
            rr::WindowRectangle::WindowRectangle
                      ((WindowRectangle *)local_150,cellL1Rect.height,cellL1Rect.width,width_,
                       height_);
            tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(renderCmd.color.m_data + 3),0.0);
            ClearCommand::ClearCommand
                      (&local_178,(WindowRectangle *)local_150,0x400,
                       (Vec4 *)(renderCmd.color.m_data + 3),(int)stencil_);
            std::
            vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
            ::push_back(clearCommands,&local_178);
            RenderCommand::RenderCommand((RenderCommand *)local_1fc);
            local_1fc._0_4_ = FACETYPE_FRONT;
            renderCmd.params._64_4_ = afStack_94[x * 3 + y];
            renderCmd.params.stencil[1].depthPassOp._0_1_ = 1;
            renderCmd.params.stencil[1].writeMask = 0x207;
            renderCmd.params.depthFunc._0_1_ = 1;
            tcu::Vector<bool,_4>::Vector(&local_200,false);
            renderCmd.color.m_data[2] = (float)local_200.m_data;
            renderCmd.params.depth = (float)local_150._0_4_;
            renderCmd.params.depthWriteMask = (bool)local_150[4];
            renderCmd.params._77_3_ = local_150._5_3_;
            renderCmd.rect.left = cellL1Rect.left;
            renderCmd.rect.bottom = cellL1Rect.bottom;
            std::
            vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ::push_back(renderCommands,(value_type *)local_1fc);
          }
        }
      }
    }
    return;
  }
  local_cd = 1;
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Too small render target",&local_b9);
  tcu::NotSupportedError::NotSupportedError(this,&local_b8);
  local_cd = 0;
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void generateBaseClearAndDepthCommands (const TestRenderTarget& target, vector<ClearCommand>& clearCommands, vector<RenderCommand>& renderCommands)
{
	DE_ASSERT(clearCommands.empty());
	DE_ASSERT(renderCommands.empty());

	const int		numL0CellsX		= 4;
	const int		numL0CellsY		= 4;
	const int		numL1CellsX		= 3;
	const int		numL1CellsY		= 1;
	int				cellL0Width		= target.width/numL0CellsX;
	int				cellL0Height	= target.height/numL0CellsY;
	int				cellL1Width		= cellL0Width/numL1CellsX;
	int				cellL1Height	= cellL0Height/numL1CellsY;

	int				stencilValues[numL0CellsX*numL0CellsY];
	float			depthValues[numL1CellsX*numL1CellsY];

	if (cellL0Width <= 0 || cellL1Width <= 0 || cellL0Height <= 0 || cellL1Height <= 0)
		throw tcu::NotSupportedError("Too small render target");

	// Fullscreen clear to black.
	clearCommands.push_back(ClearCommand(rr::WindowRectangle(0, 0, target.width, target.height), GL_COLOR_BUFFER_BIT, Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0));

	// Compute stencil values: numL0CellsX*numL0CellsY combinations of lowest and highest bits.
	getStencilTestValues(target.stencilBits, numL0CellsX*numL0CellsY, &stencilValues[0]);

	// Compute depth values
	{
		int		numValues		= DE_LENGTH_OF_ARRAY(depthValues);
		float	depthStep		= 2.0f/(float)(numValues-1);

		for (int ndx = 0; ndx < numValues; ndx++)
			depthValues[ndx] = -1.0f + depthStep*(float)ndx;
	}

	for (int y0 = 0; y0 < numL0CellsY; y0++)
	{
		for (int x0 = 0; x0 < numL0CellsX; x0++)
		{
			int stencilValue = stencilValues[y0*numL0CellsX + x0];

			for (int y1 = 0; y1 < numL1CellsY; y1++)
			{
				for (int x1 = 0; x1 < numL1CellsX; x1++)
				{
					int					x			= x0*cellL0Width + x1*cellL1Width;
					int					y			= y0*cellL0Height + y1*cellL1Height;
					rr::WindowRectangle	cellL1Rect	(x, y, cellL1Width, cellL1Height);

					clearCommands.push_back(ClearCommand(cellL1Rect, GL_STENCIL_BUFFER_BIT, Vec4(0), stencilValue));

					RenderCommand renderCmd;
					renderCmd.params.visibleFace		= rr::FACETYPE_FRONT;
					renderCmd.params.depth				= depthValues[y1*numL1CellsX + x1];;
					renderCmd.params.depthTestEnabled	= true;
					renderCmd.params.depthFunc			= GL_ALWAYS;
					renderCmd.params.depthWriteMask		= true;
					renderCmd.colorMask					= tcu::BVec4(false);
					renderCmd.rect						= cellL1Rect;

					renderCommands.push_back(renderCmd);
				}
			}
		}
	}
}